

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O2

int __thiscall
adios2::helper::CommImplMPI::Win_lock_all(CommImplMPI *this,int assert,Win *win,string *hint)

{
  int value;
  undefined8 uVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar1 = adios2::helper::CommWinImpl::Get(win);
  lVar2 = __dynamic_cast(uVar1,&CommWinImpl::typeinfo,&CommWinImplMPI::typeinfo,0);
  value = MPI_Win_lock_all(assert,*(undefined8 *)(lVar2 + 8));
  std::operator+(&local_38,"in call to Win_Lock_all ",hint);
  std::operator+(&bStack_58,&local_38,"\n");
  anon_unknown_1::CheckMPIReturn(value,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return value;
}

Assistant:

int CommImplMPI::Win_lock_all(int assert, Comm::Win &win, const std::string &hint) const
{
    CommWinImplMPI *w = dynamic_cast<CommWinImplMPI *>(CommWinImpl::Get(win));
    int ret = MPI_Win_lock_all(assert, w->m_Win);
    CheckMPIReturn(ret, "in call to Win_Lock_all " + hint + "\n");
    return ret;
}